

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol4f
          (X3DImporter *this,int pAttrIdx,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pValue)

{
  aiColor4t<float> *__args;
  pointer *ppaVar1;
  iterator __position;
  _List_node_base *p_Var2;
  float fVar3;
  _List_node_base *p_Var4;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tlist;
  _List_node_base local_30;
  size_type local_20;
  
  local_20 = 0;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  XML_ReadNode_GetAttrVal_AsListCol4f
            (this,pAttrIdx,(list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_30);
  p_Var2 = local_30._M_next;
  if (local_30._M_next != &local_30) {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(pValue,local_20);
    for (p_Var4 = local_30._M_next; p_Var2 = local_30._M_next, p_Var4 != &local_30;
        p_Var4 = p_Var4->_M_next) {
      __args = (aiColor4t<float> *)(p_Var4 + 1);
      __position._M_current =
           (pValue->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pValue->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
        _M_realloc_insert<aiColor4t<float>const&>
                  ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)pValue,__position,
                   __args);
      }
      else {
        fVar3 = __args->g;
        p_Var2 = p_Var4[1]._M_prev;
        (__position._M_current)->r = __args->r;
        (__position._M_current)->g = fVar3;
        *(_List_node_base **)&(__position._M_current)->b = p_Var2;
        ppaVar1 = &(pValue->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
  }
  while (p_Var2 != &local_30) {
    p_Var4 = (((_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&p_Var2->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var4;
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol4f(const int pAttrIdx, std::vector<aiColor4D>& pValue)
{
    std::list<aiColor4D> tlist;

	XML_ReadNode_GetAttrVal_AsListCol4f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
        for ( std::list<aiColor4D>::iterator it = tlist.begin(); it != tlist.end(); ++it )
        {
            pValue.push_back( *it );
        }
	}
}